

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::BitmapFillRespsectsClipsFillAreaByBitmapBounds(RendererTests *this)

{
  allocator local_271;
  string local_270 [32];
  LocationInfo local_250;
  undefined1 local_228 [8];
  fill_log_entry reference2 [7];
  allocator local_171;
  string local_170 [32];
  LocationInfo local_150;
  undefined1 local_128 [8];
  fill_log_entry reference1 [6];
  undefined1 local_90 [8];
  blender<int,_unsigned_char> blender;
  undefined1 local_68 [8];
  bitmap<int,_0UL,_0UL> bitmap2;
  bitmap<int,_0UL,_0UL> bitmap1;
  rect_i r;
  RendererTests *this_local;
  
  bitmap1._width = 0xffffffff;
  bitmap1._height = 0xfffffc16;
  tests::mocks::bitmap<int,_0UL,_0UL>::bitmap((bitmap<int,_0UL,_0UL> *)&bitmap2._width,5,6);
  tests::mocks::bitmap<int,_0UL,_0UL>::bitmap((bitmap<int,_0UL,_0UL> *)local_68,0xf,7);
  tests::mocks::blender<int,_unsigned_char>::blender((blender<int,_unsigned_char> *)local_90);
  fill<agge::tests::mocks::bitmap<int,0ul,0ul>,agge::tests::mocks::blender<int,unsigned_char>>
            ((bitmap<int,_0UL,_0UL> *)&bitmap2._width,(rect_i *)&bitmap1._width,
             (blender<int,_unsigned_char> *)local_90);
  local_128 = (undefined1  [8])
              tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr
                        ((bitmap<int,_0UL,_0UL> *)&bitmap2._width,0);
  reference1[0].pixels._0_4_ = 0;
  reference1[0].pixels._4_4_ = 0;
  reference1[0].x = 5;
  reference1[0]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)&bitmap2._width,1);
  reference1[1].pixels._0_4_ = 0;
  reference1[1].pixels._4_4_ = 1;
  reference1[1].x = 5;
  reference1[1]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)&bitmap2._width,2);
  reference1[2].pixels._0_4_ = 0;
  reference1[2].pixels._4_4_ = 2;
  reference1[2].x = 5;
  reference1[2]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)&bitmap2._width,3);
  reference1[3].pixels._0_4_ = 0;
  reference1[3].pixels._4_4_ = 3;
  reference1[3].x = 5;
  reference1[3]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)&bitmap2._width,4);
  reference1[4].pixels._0_4_ = 0;
  reference1[4].pixels._4_4_ = 4;
  reference1[4].x = 5;
  reference1[4]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)&bitmap2._width,5);
  reference1[5].pixels._0_4_ = 0;
  reference1[5].pixels._4_4_ = 5;
  reference1[5].x = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_171);
  ut::LocationInfo::LocationInfo(&local_150,(string *)local_170,0x416);
  ut::
  are_equal<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,6ul,std::vector<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,std::allocator<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry>>>
            ((fill_log_entry (*) [6])local_128,
             (vector<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
              *)local_90,&local_150);
  ut::LocationInfo::~LocationInfo(&local_150);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::
  vector<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ::clear((vector<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
           *)local_90);
  fill<agge::tests::mocks::bitmap<int,0ul,0ul>,agge::tests::mocks::blender<int,unsigned_char>>
            ((bitmap<int,_0UL,_0UL> *)local_68,(rect_i *)&bitmap1._width,
             (blender<int,_unsigned_char> *)local_90);
  local_228 = (undefined1  [8])
              tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)local_68,0);
  reference2[0].pixels._0_4_ = 0;
  reference2[0].pixels._4_4_ = 0;
  reference2[0].x = 0xf;
  reference2[0]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)local_68,1);
  reference2[1].pixels._0_4_ = 0;
  reference2[1].pixels._4_4_ = 1;
  reference2[1].x = 0xf;
  reference2[1]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)local_68,2);
  reference2[2].pixels._0_4_ = 0;
  reference2[2].pixels._4_4_ = 2;
  reference2[2].x = 0xf;
  reference2[2]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)local_68,3);
  reference2[3].pixels._0_4_ = 0;
  reference2[3].pixels._4_4_ = 3;
  reference2[3].x = 0xf;
  reference2[3]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)local_68,4);
  reference2[4].pixels._0_4_ = 0;
  reference2[4].pixels._4_4_ = 4;
  reference2[4].x = 0xf;
  reference2[4]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)local_68,5);
  reference2[5].pixels._0_4_ = 0;
  reference2[5].pixels._4_4_ = 5;
  reference2[5].x = 0xf;
  reference2[5]._16_8_ =
       tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr((bitmap<int,_0UL,_0UL> *)local_68,6);
  reference2[6].pixels._0_4_ = 0;
  reference2[6].pixels._4_4_ = 6;
  reference2[6].x = 0xf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_271);
  ut::LocationInfo::LocationInfo(&local_250,(string *)local_270,0x429);
  ut::
  are_equal<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,7ul,std::vector<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,std::allocator<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry>>>
            ((fill_log_entry (*) [7])local_228,
             (vector<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
              *)local_90,&local_250);
  ut::LocationInfo::~LocationInfo(&local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  tests::mocks::blender<int,_unsigned_char>::~blender((blender<int,_unsigned_char> *)local_90);
  tests::mocks::bitmap<int,_0UL,_0UL>::~bitmap((bitmap<int,_0UL,_0UL> *)local_68);
  tests::mocks::bitmap<int,_0UL,_0UL>::~bitmap((bitmap<int,_0UL,_0UL> *)&bitmap2._width);
  return;
}

Assistant:

test( BitmapFillRespsectsClipsFillAreaByBitmapBounds )
			{
				// INIT
				rect_i r = { -1, -1002, 3000, 152 };
				mocks::bitmap<int> bitmap1(5, 6);
				mocks::bitmap<int> bitmap2(15, 7);
				mocks::blender<int, uint8_t> blender;

				// ACT
				fill(bitmap1, r, blender);

				// ASSERT
				mocks::blender<int, uint8_t>::fill_log_entry reference1[] = {
					{ bitmap1.row_ptr(0), 0, 0, 5 },
					{ bitmap1.row_ptr(1), 0, 1, 5 },
					{ bitmap1.row_ptr(2), 0, 2, 5 },
					{ bitmap1.row_ptr(3), 0, 3, 5 },
					{ bitmap1.row_ptr(4), 0, 4, 5 },
					{ bitmap1.row_ptr(5), 0, 5, 5 },
				};

				assert_equal(reference1, blender.filling_log);

				// INIT
				blender.filling_log.clear();

				// ACT
				fill(bitmap2, r, blender);

				// ASSERT
				mocks::blender<int, uint8_t>::fill_log_entry reference2[] = {
					{ bitmap2.row_ptr(0), 0, 0, 15 },
					{ bitmap2.row_ptr(1), 0, 1, 15 },
					{ bitmap2.row_ptr(2), 0, 2, 15 },
					{ bitmap2.row_ptr(3), 0, 3, 15 },
					{ bitmap2.row_ptr(4), 0, 4, 15 },
					{ bitmap2.row_ptr(5), 0, 5, 15 },
					{ bitmap2.row_ptr(6), 0, 6, 15 },
				};

				assert_equal(reference2, blender.filling_log);
			}